

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingImpl.hpp
# Opt level: O0

void __thiscall
Diligent::ResourceMappingImpl::ResMappingHashKey::ResMappingHashKey
          (ResMappingHashKey *this,Char *Str,bool bMakeCopy,Uint32 ArrInd)

{
  size_t sVar1;
  size_t local_28;
  Uint32 local_20;
  undefined1 local_19;
  Uint32 ArrInd_local;
  bool bMakeCopy_local;
  Char *Str_local;
  ResMappingHashKey *this_local;
  
  local_20 = ArrInd;
  local_19 = bMakeCopy;
  _ArrInd_local = Str;
  Str_local = (Char *)this;
  HashMapStringKey::HashMapStringKey(&this->super_HashMapStringKey,Str,bMakeCopy);
  this->ArrayIndex = local_20;
  local_28 = HashMapStringKey::GetHash(&this->super_HashMapStringKey);
  sVar1 = ComputeHash<unsigned_long,unsigned_int>(&local_28,&local_20);
  (this->super_HashMapStringKey).Ownership_Hash =
       sVar1 & 0x7fffffffffffffff |
       (this->super_HashMapStringKey).Ownership_Hash & 0x8000000000000000;
  return;
}

Assistant:

ResMappingHashKey(const Char* Str, bool bMakeCopy, Uint32 ArrInd) noexcept :
            HashMapStringKey{Str, bMakeCopy},
            ArrayIndex{ArrInd}
        {
            Ownership_Hash = (ComputeHash(GetHash(), ArrInd) & HashMask) | (Ownership_Hash & StrOwnershipMask);
        }